

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int util::compareChar(char *str1,char *str2)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar3 = strlen(str1);
  sVar4 = strlen(str2);
  sVar5 = sVar3;
  if (sVar4 < sVar3) {
    sVar5 = sVar4;
  }
  sVar6 = 0;
  while( true ) {
    if (sVar5 == sVar6) {
      if (sVar3 < sVar4) {
        return -1;
      }
      return (uint)(sVar4 != sVar3);
    }
    pcVar1 = str1 + sVar6;
    pcVar2 = str2 + sVar6;
    if (*pcVar1 < *pcVar2) break;
    sVar6 = sVar6 + 1;
    if (*pcVar2 < *pcVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

int util::compareChar(const char* str1, const char* str2){

    for(int i = 0 ; i < min(strlen(str1), strlen(str2)); i++){
        if(str1[i] < str2[i])
            return -1;
        else if (str1[i] > str2[i])
            return 1;
    }
    if(strlen(str2) > strlen(str1))
        return -1;
    else if(strlen(str2) == strlen(str1))
        return 0;
    return 1;
}